

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expected-main.t.hpp
# Opt level: O1

ostream * lest::operator<<(ostream *os,expected<Implicit,_char> *v)

{
  ostream *poVar1;
  ForStreamable<Implicit,_std::string> local_30;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"[expected:",10);
  if ((v->contained).super_storage_t_impl<Implicit,_char>.m_has_value == true) {
    make_string<Implicit>(&local_30,(Implicit *)v);
  }
  else {
    local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"[empty]","");
  }
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (os,local_30._M_dataplus._M_p,local_30._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"]",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return poVar1;
}

Assistant:

inline std::ostream & operator<<( std::ostream & os, nonstd::expected<T,E> const & v )
{
    using lest::to_string;
    return os << "[expected:" << (v ? to_string(*v) : "[empty]") << "]";
}